

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::SplitConstructorCallCommon
          (Inline *this,Instr *newObjInstr,Opnd *lastArgOpnd,OpCode newObjOpCode,bool isInlined,
          bool isFixed,Instr **createObjInstrOut,Instr **callCtorInstrOut)

{
  undefined1 *puVar1;
  ushort profiledCallSiteId;
  Func *pFVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ValueType valueType;
  undefined4 *puVar8;
  JITTimeConstructorCache *this_00;
  ProfiledInstr *this_01;
  FixedFieldInfo *this_02;
  intptr_t iVar9;
  intptr_t iVar10;
  AddrOpnd *src1Opnd;
  StackSym *sym;
  SymOpnd *dstOpnd;
  Instr *pIVar11;
  Instr *instr;
  Instr *pIVar12;
  Opnd *pOVar13;
  OpCode OVar14;
  bool bVar15;
  AddrOpnd *local_48;
  
  if (newObjInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1123,"(newObjInstr)","newObjInstr");
    if (!bVar4) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  if (newObjInstr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1124,"(newObjInstr->GetSrc1())","newObjInstr->GetSrc1()");
    if (!bVar4) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  if (lastArgOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1125,"(lastArgOpnd)","lastArgOpnd");
    if (!bVar4) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  if (!isInlined && !isFixed) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1126,"(isInlined || isFixed)","isInlined || isFixed");
    if (!bVar4) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  pFVar2 = newObjInstr->m_func;
  if (newObjInstr->m_kind == InstrKindProfiled) {
    profiledCallSiteId = *(ushort *)&newObjInstr[1]._vptr_Instr;
    this_00 = Func::GetConstructorCache(newObjInstr->m_func,profiledCallSiteId);
    bVar15 = this_00 == (JITTimeConstructorCache *)0x0;
    if (bVar15) {
      bVar4 = false;
      bVar5 = false;
    }
    else {
      bVar4 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_00);
      bVar5 = JITTimeConstructorCache::SkipNewScObject(this_00);
    }
    if (bVar5 == false) {
      local_48 = (AddrOpnd *)IR::RegOpnd::New(TyVar,pFVar2);
      this_01 = IR::ProfiledInstr::New(newObjOpCode,(Opnd *)local_48,newObjInstr->m_src1,pFVar2);
      if ((this_01->super_Instr).m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar6) goto LAB_0055d39c;
        *puVar8 = 0;
      }
      *(uint *)&this_01->u = (uint)profiledCallSiteId;
    }
    else {
      this_01 = (ProfiledInstr *)0x0;
      local_48 = (AddrOpnd *)0x0;
    }
  }
  else {
    local_48 = (AddrOpnd *)IR::RegOpnd::New(TyVar,pFVar2);
    this_01 = (ProfiledInstr *)
              IR::Instr::New(newObjOpCode,(Opnd *)local_48,newObjInstr->m_src1,pFVar2);
    bVar15 = true;
    bVar5 = false;
    bVar4 = false;
  }
  if ((isInlined & bVar5) == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1149,"(!isInlined || !skipNewScObj)","!isInlined || !skipNewScObj");
    if (!bVar6) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  if (bVar5 == true && !isFixed) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x114a,"(isFixed || !skipNewScObj)","isFixed || !skipNewScObj");
    if (!bVar6) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  if (bVar5 != false) {
    this_02 = IR::Instr::GetFixedFunction(newObjInstr);
    iVar9 = FixedFieldInfo::GetFuncInfoAddr(this_02);
    iVar10 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                       (this->topFunc->m_threadContextInfo);
    if (((iVar9 == iVar10) ||
        (iVar10 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                            (this->topFunc->m_threadContextInfo), iVar9 == iVar10)) &&
       (bVar6 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0), bVar6)) {
      return false;
    }
  }
  if (this_01 == (ProfiledInstr *)0x0) {
    src1Opnd = IR::AddrOpnd::NewNull(newObjInstr->m_func);
  }
  else {
    IR::Instr::SetByteCodeOffset(&this_01->super_Instr,newObjInstr);
    IR::Opnd::SetIsJITOptimizedReg((this_01->super_Instr).m_src1,true);
    puVar1 = &(this_01->super_Instr).field_0x37;
    *puVar1 = *puVar1 | 2;
    IR::Instr::InsertBefore(newObjInstr,&this_01->super_Instr);
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_48->super_Opnd,valueType);
    src1Opnd = local_48;
  }
  sym = SymTable::GetArgSlotSym(pFVar2->m_symTable,1);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,TyVar,pFVar2);
  pIVar11 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,lastArgOpnd,pFVar2);
  IR::Instr::SetByteCodeOffset(pIVar11,newObjInstr);
  IR::Opnd::SetIsJITOptimizedReg(pIVar11->m_dst,true);
  IR::Opnd::SetIsJITOptimizedReg(pIVar11->m_src2,true);
  IR::Instr::InsertBefore(newObjInstr,pIVar11);
  OVar14 = CallI;
  if (isFixed) {
    OVar14 = CallIFixed;
  }
  newObjInstr->m_opcode = OVar14;
  newObjInstr->field_0x37 = newObjInstr->field_0x37 | 0x20;
  if (newObjInstr->m_src2 != (Opnd *)0x0) {
    IR::Instr::FreeSrc2(newObjInstr);
  }
  if (newObjInstr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar6) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  func = newObjInstr->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar6) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  bVar7 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    dstOpnd = (SymOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,func);
    bVar7 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar7 | 2;
  newObjInstr->m_src2 = &dstOpnd->super_Opnd;
  pIVar11 = newObjInstr->m_next;
  if (pIVar11 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1188,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar6) goto LAB_0055d39c;
    *puVar8 = 0;
  }
  instr = IR::Instr::GetNextRealInstrOrLabel(newObjInstr);
  if (bVar4 == false) {
    if (bVar5 == false) {
      if (local_48 == (AddrOpnd *)newObjInstr->m_dst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1198,"(createObjDst != newObjInstr->GetDst())",
                           "createObjDst != newObjInstr->GetDst()");
        if (!bVar4) goto LAB_0055d39c;
        *puVar8 = 0;
      }
      IR::Opnd::SetValueType(newObjInstr->m_dst,(ValueType)0x9);
      pIVar12 = IR::Instr::New(GetNewScObject,newObjInstr->m_dst,newObjInstr->m_dst,
                               &local_48->super_Opnd,pFVar2);
      goto LAB_0055d115;
    }
  }
  else {
    pIVar12 = IR::Instr::New(Ld_A,newObjInstr->m_dst,&local_48->super_Opnd,pFVar2);
LAB_0055d115:
    IR::Instr::SetByteCodeOffset(pIVar12,instr);
    IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_dst,true);
    IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_src1,true);
    IR::Instr::InsertBefore(pIVar11,pIVar12);
  }
  if (bVar15) {
    pIVar12 = IR::Instr::New(UpdateNewScObjectCache,pFVar2);
    pOVar13 = newObjInstr->m_src1;
    if (pIVar12->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_0055d39c;
      *puVar8 = 0;
    }
    pFVar2 = pIVar12->m_func;
    if (pOVar13->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_0055d39c;
      *puVar8 = 0;
    }
    bVar7 = pOVar13->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar13 = IR::Opnd::Copy(pOVar13,pFVar2);
      bVar7 = pOVar13->field_0xb;
    }
    pOVar13->field_0xb = bVar7 | 2;
    pIVar12->m_src1 = pOVar13;
    pOVar13 = newObjInstr->m_dst;
    if (pIVar12->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_0055d39c;
      *puVar8 = 0;
    }
    pFVar2 = pIVar12->m_func;
    if (pOVar13->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) {
LAB_0055d39c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    bVar7 = pOVar13->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar13 = IR::Opnd::Copy(pOVar13,pFVar2);
      bVar7 = pOVar13->field_0xb;
    }
    pOVar13->field_0xb = bVar7 | 2;
    pIVar12->m_src2 = pOVar13;
    IR::Instr::SetByteCodeOffset(pIVar12,instr);
    IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_src1,true);
    IR::Opnd::SetIsJITOptimizedReg(pIVar12->m_src2,true);
    IR::Instr::InsertBefore(pIVar11,pIVar12);
  }
  if (createObjInstrOut != (Instr **)0x0) {
    *createObjInstrOut = &this_01->super_Instr;
  }
  if (callCtorInstrOut != (Instr **)0x0) {
    *callCtorInstrOut = newObjInstr;
  }
  return true;
}

Assistant:

bool
Inline::SplitConstructorCallCommon(
    IR::Instr *const newObjInstr,
    IR::Opnd *const lastArgOpnd,
    const Js::OpCode newObjOpCode,
    const bool isInlined,
    const bool isFixed,
    IR::Instr** createObjInstrOut,
    IR::Instr** callCtorInstrOut) const
{
    Assert(newObjInstr);
    Assert(newObjInstr->GetSrc1());
    Assert(lastArgOpnd);
    Assert(isInlined || isFixed);

    const auto callerFunc = newObjInstr->m_func;

    // Call the NoCtor version of NewScObject

    // Use a temporary register for the newly allocated object (before the call to ctor) - even if we know we'll return this
    // object from the whole operation.  That's so that we don't trash the bytecode register if we need to bail out at
    // object allocation (bytecode instruction has the form [Profiled]NewScObject R6 = R6).
    IR::RegOpnd* createObjDst = nullptr;
    IR::Instr* createObjInstr = nullptr;
    const JITTimeConstructorCache* constructorCache;
    bool returnCreatedObject = false;
    bool skipNewScObj = false;

    if (newObjInstr->IsProfiledInstr())
    {
        Js::ProfileId profiledCallSiteId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
        constructorCache = newObjInstr->m_func->GetConstructorCache(profiledCallSiteId);
        returnCreatedObject = constructorCache != nullptr && constructorCache->CtorHasNoExplicitReturnValue();
        skipNewScObj = constructorCache != nullptr && constructorCache->SkipNewScObject();
        if (!skipNewScObj)
        {
            createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
            createObjInstr = IR::ProfiledInstr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
            createObjInstr->AsProfiledInstr()->u.profileId = profiledCallSiteId;
        }
    }
    else
    {
        constructorCache = nullptr;
        createObjDst = IR::RegOpnd::New(TyVar, callerFunc);
        createObjInstr = IR::Instr::New(newObjOpCode, createObjDst, newObjInstr->GetSrc1(), callerFunc);
    }

    Assert(!isInlined || !skipNewScObj);
    Assert(isFixed || !skipNewScObj);

    // For new Object() and new Array() we have special fast helpers.  We'll let the lowerer convert this instruction directly
    // into a call to one of these helpers.
    if (skipNewScObj)
    {
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if ((ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() ||
            ctorInfo == topFunc->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()) &&
            newObjInstr->HasEmptyArgOutChain())
        {
            return false;
        }
    }

    IR::Opnd* thisPtrOpnd;
    if (createObjInstr != nullptr)
    {
        createObjInstr->SetByteCodeOffset(newObjInstr);
        createObjInstr->GetSrc1()->SetIsJITOptimizedReg(true);
        // We're splitting a single byte code, so the interpreter has to resume from the beginning if we bail out.
        createObjInstr->forcePreOpBailOutIfNeeded = true;
        newObjInstr->InsertBefore(createObjInstr);

        createObjDst->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
        thisPtrOpnd = createObjDst;
    }
    else
    {
        thisPtrOpnd = IR::AddrOpnd::NewNull(newObjInstr->m_func);
    }

    // Pass the new object to the constructor function with an ArgOut
    const auto thisArgOpnd = IR::SymOpnd::New(callerFunc->m_symTable->GetArgSlotSym(1), TyVar, callerFunc);
    auto instr = IR::Instr::New(Js::OpCode::ArgOut_A, thisArgOpnd, thisPtrOpnd, lastArgOpnd, callerFunc);
    instr->SetByteCodeOffset(newObjInstr);
    instr->GetDst()->SetIsJITOptimizedReg(true);
    instr->GetSrc2()->SetIsJITOptimizedReg(true);
    newObjInstr->InsertBefore(instr);

    // Call the constructor using CallI with isCtorCall set.  If we inline the constructor, and the inlined constructor
    // bails out, the interpreter would be entered with CallFlags_Value as well. If the interpreter starts using the
    // call flags, the proper call flags will need to be specified here by using a different op code specific to constructors.
    if (isFixed)
    {
        newObjInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        newObjInstr->m_opcode = Js::OpCode::CallI;
    }

    newObjInstr->isCtorCall = true;

    if(newObjInstr->GetSrc2())
    {
        newObjInstr->FreeSrc2();
    }
    newObjInstr->SetSrc2(thisArgOpnd);

    const auto insertBeforeInstr = newObjInstr->m_next;
    Assert(insertBeforeInstr);
    const auto nextByteCodeOffsetInstr = newObjInstr->GetNextRealInstrOrLabel();

    // Determine which object to use as the final result of NewScObject, the object passed into the constructor as 'this', or
    // the object returned by the constructor.  We only need this if we don't have a hard-coded constructor cache, or if the
    // constructor returns something explicitly.  Otherwise, we simply return the object we allocated and passed to the constructor.
    if (returnCreatedObject)
    {
        instr = IR::Instr::New(Js::OpCode::Ld_A, newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }
    else if (!skipNewScObj)
    {
        Assert(createObjDst != newObjInstr->GetDst());

        // Since we're not returning the default new object, the constructor must be returning something explicitly.  We don't
        // know at this point whether it's an object or not.  If the constructor is later inlined, the value type will be determined
        // from the flow in glob opt.  Otherwise, we'll need to emit an object check.
        newObjInstr->GetDst()->SetValueType(ValueType::Uninitialized);

        instr = IR::Instr::New(Js::OpCode::GetNewScObject, newObjInstr->GetDst(), newObjInstr->GetDst(), createObjDst, callerFunc);
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetDst()->SetIsJITOptimizedReg(true);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    // Update the NewScObject cache, but only if we don't have a hard-coded constructor cache.  We only clone caches that
    // don't require update, and once updated a cache never requires an update again.
    if (constructorCache == nullptr)
    {
        instr = IR::Instr::New(Js::OpCode::UpdateNewScObjectCache, callerFunc);
        instr->SetSrc1(newObjInstr->GetSrc1()); // constructor function
        instr->SetSrc2(newObjInstr->GetDst());  // the new object
        instr->SetByteCodeOffset(nextByteCodeOffsetInstr);
        instr->GetSrc1()->SetIsJITOptimizedReg(true);
        instr->GetSrc2()->SetIsJITOptimizedReg(true);
        insertBeforeInstr->InsertBefore(instr);
    }

    if (createObjInstrOut != nullptr)
    {
        *createObjInstrOut = createObjInstr;
    }

    if (callCtorInstrOut != nullptr)
    {
        *callCtorInstrOut = newObjInstr;
    }

    return true;
}